

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_voice.c
# Opt level: O3

void stream_read(void *source,void **vbuf,uint *samples,ALLEGRO_AUDIO_DEPTH buffer_depth,
                size_t dest_maxc)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  
  uVar1 = *(uint *)((long)source + 0x8c);
  uVar2 = *(uint *)((long)source + 0xbc);
  if (*(char *)((long)source + 0xa8) == '\0') {
LAB_0010d8fd:
    *vbuf = (void *)0x0;
    *samples = 0;
  }
  else {
    if (uVar1 < *samples) {
      *samples = uVar1;
    }
    if (uVar2 < uVar1) {
      sVar3 = al_get_channel_count(*(ALLEGRO_CHANNEL_CONF *)((long)source + 0x84));
      sVar4 = al_get_audio_depth_size(*(ALLEGRO_AUDIO_DEPTH *)((long)source + 0x80));
      *vbuf = (void *)((long)(int)((int)sVar4 * (int)sVar3 * uVar2) +
                      **(long **)((long)source + 0x120));
      uVar5 = *samples + uVar2;
      if (uVar1 < *samples + uVar2) {
        *samples = uVar1 - uVar2;
        uVar5 = uVar1;
      }
    }
    else {
      _al_kcm_refill_stream((ALLEGRO_AUDIO_STREAM *)source);
      if ((void *)**(long **)((long)source + 0x120) == (void *)0x0) {
        if (*(char *)((long)source + 0x130) == '\x01') {
          *(undefined1 *)((long)source + 0xa8) = 0;
        }
        goto LAB_0010d8fd;
      }
      *vbuf = (void *)**(long **)((long)source + 0x120);
      uVar5 = *samples;
      _al_kcm_emit_stream_events((ALLEGRO_AUDIO_STREAM *)source);
    }
    *(uint *)((long)source + 0xbc) = uVar5;
  }
  return;
}

Assistant:

static void stream_read(void *source, void **vbuf, unsigned int *samples,
   ALLEGRO_AUDIO_DEPTH buffer_depth, size_t dest_maxc)
{
   ALLEGRO_AUDIO_STREAM *stream = (ALLEGRO_AUDIO_STREAM*)source;
   unsigned int len = stream->spl.spl_data.len;
   unsigned int pos = stream->spl.pos;

   if (!stream->spl.is_playing) {
      *vbuf = NULL;
      *samples = 0;
      return;
   }

   if (*samples > len)
      *samples = len;

   if (pos >= len) {
      /* XXX: Handle the case where we need to call _al_kcm_refill_stream
       * multiple times due to ludicrous playback speed. */
      _al_kcm_refill_stream(stream);
      if (!stream->pending_bufs[0]) {
         if (stream->is_draining) {
            stream->spl.is_playing = false;
         }
         *vbuf = NULL;
         *samples = 0;
         return;
      }
      *vbuf = stream->pending_bufs[0];
      pos = *samples;

      _al_kcm_emit_stream_events(stream);
   }
   else {
      int bytes = pos * al_get_channel_count(stream->spl.spl_data.chan_conf)
                      * al_get_audio_depth_size(stream->spl.spl_data.depth);
      *vbuf = ((char *)stream->pending_bufs[0]) + bytes;

      if (pos + *samples > len)
         *samples = len - pos;
      pos += *samples;
   }

   stream->spl.pos = pos;

   (void)dest_maxc;
   (void)buffer_depth;
}